

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O1

void aom_v_predictor_32x16_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  uint8_t *puVar6;
  
  uVar1 = *(undefined8 *)above;
  uVar2 = *(undefined8 *)(above + 8);
  uVar3 = *(undefined8 *)(above + 0x10);
  uVar4 = *(undefined8 *)(above + 0x18);
  puVar6 = dst + 0x10;
  iVar5 = 0x10;
  do {
    *(undefined8 *)(puVar6 + -0x10) = uVar1;
    *(undefined8 *)(puVar6 + -8) = uVar2;
    *(undefined8 *)puVar6 = uVar3;
    *(undefined8 *)(puVar6 + 8) = uVar4;
    puVar6 = puVar6 + stride;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

static inline void v_predictor_32xh(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, int height) {
  const __m128i row0 = _mm_load_si128((__m128i const *)above);
  const __m128i row1 = _mm_load_si128((__m128i const *)(above + 16));
  for (int i = 0; i < height; ++i) {
    _mm_store_si128((__m128i *)dst, row0);
    _mm_store_si128((__m128i *)(dst + 16), row1);
    dst += stride;
  }
}